

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QLocale::MeasurementSystem,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  undefined8 in_RDX;
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug local_18 [2];
  QDebug *this;
  
  this = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(local_18,in_RSI);
  ::operator<<(in_RSI,(MeasurementSystem)((ulong)in_RDX >> 0x20));
  QDebug::~QDebug(this);
  QDebug::~QDebug(this);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }